

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
          (HighsPostsolveStack *this,HighsInt col,double fixValue,double colCost,
          HighsMatrixSlice<HighsEmptySlice> *colVec)

{
  HighsSliceNonzero *pHVar1;
  char *pcVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int iVar4;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_RSI;
  HighsDataStack *in_RDI;
  HighsSliceNonzero *colVal;
  HighsSliceNonzero *__end0;
  HighsSliceNonzero *__begin0;
  HighsMatrixSlice<HighsEmptySlice> *__range2;
  double *in_stack_ffffffffffffff70;
  FixedCol *in_stack_ffffffffffffff78;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff80;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_stack_ffffffffffffff88;
  HighsSliceNonzero *local_38;
  
  iVar4 = (int)in_RSI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x724803);
  local_38 = HighsMatrixSlice<HighsEmptySlice>::begin();
  pHVar1 = HighsMatrixSlice<HighsEmptySlice>::end();
  uVar3 = extraout_RDX;
  for (; local_38 != pHVar1; local_38 = local_38 + 1) {
    in_stack_ffffffffffffff80 = (HighsPostsolveStack *)(in_RDI + 6);
    in_stack_ffffffffffffff78 = (FixedCol *)&in_RDI[3].position;
    pcVar2 = HighsSliceNonzero::index(local_38,(char *)in_RSI,(int)uVar3);
    in_RSI = (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              *)std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78,
                           (long)(int)pcVar2);
    HighsSliceNonzero::value(local_38);
    in_stack_ffffffffffffff88 = in_RSI;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70);
    uVar3 = extraout_RDX_00;
  }
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)iVar4);
  HighsDataStack::push<presolve::HighsPostsolveStack::FixedCol,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(in_RDI,in_stack_ffffffffffffff88);
  reductionAdded(in_stack_ffffffffffffff80,type);
  return;
}

Assistant:

void removedFixedCol(HighsInt col, double fixValue, double colCost,
                       const HighsMatrixSlice<ColStorageFormat>& colVec) {
    assert(std::isfinite(fixValue));
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FixedCol{fixValue, colCost, origColIndex[col],
                                  HighsBasisStatus::kNonbasic});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }